

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,_float>,_Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>,_4,_0>
       ::run(redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>_>
             *mat,scalar_sum_op<float,_float> *func)

{
  bool bVar1;
  int iVar2;
  Index IVar3;
  Index IVar4;
  long lVar5;
  CoeffReturnType b;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float afVar6 [4];
  long local_78;
  Index i_1;
  Index j_1;
  long local_58;
  Index i;
  Index j;
  PacketType packet_res;
  Scalar res;
  Index packetedInnerSize;
  Index outerSize;
  Index innerSize;
  scalar_sum_op<float,_float> *func_local;
  redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>_> *mat_local;
  
  IVar3 = redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>::
          rows(mat);
  bVar1 = false;
  if (0 < IVar3) {
    IVar3 = redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>::
            cols(mat);
    bVar1 = false;
    if (0 < IVar3) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    IVar3 = redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>::
            innerSize(mat);
    IVar4 = redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>::
            outerSize(mat);
    lVar5 = IVar3 / 4 << 2;
    if (lVar5 == 0) {
      packet_res[3] =
           redux_impl<Eigen::internal::scalar_sum_op<float,_float>,_Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>,_0,_0>
           ::run(mat,func);
    }
    else {
      afVar6 = redux_evaluator<Eigen::Block<Eigen::Matrix<float,48,24,0,48,24>,-1,-1,false>>::
               packet<0,float__vector(4)>
                         ((redux_evaluator<Eigen::Block<Eigen::Matrix<float,48,24,0,48,24>,_1,_1,false>>
                           *)mat,0,0);
      unique0x10000074 = (float)extraout_XMM0_Dc;
      j._0_4_ = (float)(int)afVar6._0_8_;
      j._4_4_ = (float)(int)((ulong)afVar6._0_8_ >> 0x20);
      unique0x10000078 = extraout_XMM0_Dd;
      for (i = 0; i < IVar4; i = i + 1) {
        iVar2 = 0;
        if (i == 0) {
          iVar2 = 4;
        }
        for (local_58 = (long)iVar2; local_58 < lVar5; local_58 = local_58 + 4) {
          afVar6 = redux_evaluator<Eigen::Block<Eigen::Matrix<float,48,24,0,48,24>,-1,-1,false>>::
                   packetByOuterInner<0,float__vector(4)>
                             ((redux_evaluator<Eigen::Block<Eigen::Matrix<float,48,24,0,48,24>,_1,_1,false>>
                               *)mat,i,local_58);
          unique0x10000098 = (float)extraout_XMM0_Dc_00;
          j_1._0_4_ = (float)(int)afVar6._0_8_;
          j_1._4_4_ = (float)(int)((ulong)afVar6._0_8_ >> 0x20);
          unique0x1000009c = extraout_XMM0_Dd_00;
          afVar6 = scalar_sum_op<float,float>::packetOp<float__vector(4)>
                             ((scalar_sum_op<float,float> *)func,(float (*) [4])&j,
                              (float (*) [4])&j_1);
          unique0x100000bc = (float)extraout_XMM0_Dc_01;
          j._0_4_ = (float)(int)afVar6._0_8_;
          j._4_4_ = (float)(int)((ulong)afVar6._0_8_ >> 0x20);
          unique0x100000c0 = extraout_XMM0_Dd_01;
        }
      }
      packet_res[3] =
           scalar_sum_op<float,float>::predux<float__vector(4)>
                     ((scalar_sum_op<float,float> *)func,(float (*) [4])&j);
      for (i_1 = 0; local_78 = lVar5, i_1 < IVar4; i_1 = i_1 + 1) {
        for (; local_78 < IVar3; local_78 = local_78 + 1) {
          b = redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>
              ::coeffByOuterInner(mat,i_1,local_78);
          packet_res[3] = scalar_sum_op<float,_float>::operator()(func,packet_res + 3,b);
        }
      }
    }
    return packet_res[3];
  }
  __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/Redux.h"
                ,0x114,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<float>, Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float, 48, 24>>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<float>, Derived = Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float, 48, 24>>>, Traversal = 4, Unrolling = 0]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC static Scalar run(const Derived &mat, const Func& func)
  {
    eigen_assert(mat.rows()>0 && mat.cols()>0 && "you are using an empty matrix");
    const Index innerSize = mat.innerSize();
    const Index outerSize = mat.outerSize();
    enum {
      packetSize = redux_traits<Func, Derived>::PacketSize
    };
    const Index packetedInnerSize = ((innerSize)/packetSize)*packetSize;
    Scalar res;
    if(packetedInnerSize)
    {
      PacketType packet_res = mat.template packet<Unaligned,PacketType>(0,0);
      for(Index j=0; j<outerSize; ++j)
        for(Index i=(j==0?packetSize:0); i<packetedInnerSize; i+=Index(packetSize))
          packet_res = func.packetOp(packet_res, mat.template packetByOuterInner<Unaligned,PacketType>(j,i));

      res = func.predux(packet_res);
      for(Index j=0; j<outerSize; ++j)
        for(Index i=packetedInnerSize; i<innerSize; ++i)
          res = func(res, mat.coeffByOuterInner(j,i));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = redux_impl<Func, Derived, DefaultTraversal, NoUnrolling>::run(mat, func);
    }

    return res;
  }